

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

void Gia_ManAreCompress(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  Gia_PtrAre_t GVar1;
  uint **ppuVar2;
  Gia_PtrAre_t GVar3;
  int iVar4;
  uint *puVar5;
  Gia_PtrAre_t GVar6;
  uint *puVar7;
  
  GVar6 = *pRoot;
  if (((uint)GVar6 & 0x7fffffff) != 0) {
    GVar3 = (Gia_PtrAre_t)((uint)GVar6 & 0x80000000);
    *pRoot = GVar3;
    ppuVar2 = p->ppStas;
    iVar4 = p->nSize;
    puVar5 = *ppuVar2;
    puVar7 = (uint *)((long)(int)(((uint)GVar6 & 0xfffff) * iVar4) * 4 +
                     *(long *)((long)ppuVar2 + (ulong)((uint)GVar6 >> 0x11 & 0x3ff8)));
    while (puVar5 != puVar7) {
      GVar1 = *(Gia_PtrAre_t *)(puVar7 + 1);
      if (-1 < (int)*puVar7) {
        *(Gia_PtrAre_t *)(puVar7 + 1) = GVar3;
        *pRoot = GVar6;
        ppuVar2 = p->ppStas;
        iVar4 = p->nSize;
        puVar5 = *ppuVar2;
        GVar3 = GVar6;
      }
      GVar6 = GVar1;
      puVar7 = (uint *)((long)(int)(((uint)GVar1 & 0xfffff) * iVar4) * 4 +
                       *(long *)((long)ppuVar2 + (ulong)((uint)GVar1 >> 0x11 & 0x3ff8)));
    }
    return;
  }
  __assert_fail("pRoot->nItem || pRoot->nPage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
}

Assistant:

static inline void Gia_ManAreCompress( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iList = *pRoot;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pRoot->nItem = 0; 
    pRoot->nPage = 0;
    for ( iCube = iList, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        pCube->iNext = *pRoot;
        *pRoot = iCube;
    }
}